

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O2

JL_STATUS JlAttachObjectToListObject(JlDataObject *ListObject,JlDataObject *NewObject)

{
  JlListItem *pJVar1;
  JL_STATUS JVar2;
  JlListItem *pJVar3;
  JlListItem *pJVar4;
  
  if (NewObject != (JlDataObject *)0x0 && ListObject != (JlDataObject *)0x0) {
    if (ListObject->Type == JL_DATA_TYPE_LIST) {
      pJVar3 = (JlListItem *)WjTestLib_Calloc(0x18,1);
      if (pJVar3 == (JlListItem *)0x0) {
        JVar2 = JL_STATUS_OUT_OF_MEMORY;
      }
      else {
        pJVar3->Next = (JlListItem *)0x0;
        pJVar3->Object = NewObject;
        pJVar3->ParentList = (JlList *)&ListObject->field_2;
        pJVar1 = (ListObject->field_2).List.ListTail;
        pJVar4 = (JlListItem *)&(ListObject->field_2).List.ListHead;
        if (pJVar1 != (JlListItem *)0x0) {
          pJVar4 = pJVar1;
        }
        pJVar4->Next = pJVar3;
        (ListObject->field_2).List.ListTail = pJVar3;
        (ListObject->field_2).Number.Type = (ListObject->field_2).Number.Type + 1;
        JVar2 = JL_STATUS_SUCCESS;
      }
    }
    else {
      JVar2 = JL_STATUS_WRONG_TYPE;
    }
    return JVar2;
  }
  return JL_STATUS_INVALID_PARAMETER;
}

Assistant:

JL_STATUS
    JlAttachObjectToListObject
    (
        JlDataObject*   ListObject,
        JlDataObject*   NewObject
    )
{
    JL_STATUS jlStatus;

    if(     NULL != ListObject
        &&  NULL != NewObject )
    {
        if( JL_DATA_TYPE_LIST == ListObject->Type )
        {
            // Create list item container for object
            JlListItem* listItem = JlNew( JlListItem );
            if( NULL != listItem )
            {
                listItem->Next = NULL;
                listItem->Object = NewObject;
                listItem->ParentList = &ListObject->List;

                JlLinkedListAddToEnd( ListObject->List.ListHead, ListObject->List.ListTail, listItem );
                ListObject->List.Count += 1;

                jlStatus = JL_STATUS_SUCCESS;
            }
            else
            {
                jlStatus = JL_STATUS_OUT_OF_MEMORY;
            }
        }
        else
        {
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}